

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

char * SoapySDRDevice_getAntenna(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined1 *puVar1;
  char *__dest;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0xe8))(&local_48,device,direction,channel);
  __dest = callocArrayType<char>(local_40 + 1);
  if (local_40 != 0) {
    memmove(__dest,local_48,local_40);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __dest;
}

Assistant:

char *SoapySDRDevice_getAntenna(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->getAntenna(direction, channel));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}